

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall
t_swift_generator::generate_swift_struct_equatable_extension
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool is_private)

{
  t_field *this_00;
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pptVar4;
  string *psVar5;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> *__lhs;
  char *pcVar6;
  char *local_138;
  t_field *tfield_1;
  t_field **local_118;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_110
  ;
  string local_108;
  string local_e8;
  t_field *local_c8;
  t_field *tfield;
  t_field **local_b8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_b0;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  string local_80;
  allocator local_49;
  string local_48 [8];
  string visibility;
  bool is_private_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_swift_generator *this_local;
  
  if (is_private) {
    local_138 = "fileprivate";
    if ((this->gen_cocoa_ & 1U) != 0) {
      local_138 = "private";
    }
  }
  else {
    local_138 = "public";
  }
  visibility.field_2._M_local_buf[0xf] = is_private;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,local_138,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,local_48);
  poVar2 = std::operator<<(poVar2," func ==(lhs: ");
  type_name_abi_cxx11_(&local_80,this,&tstruct->super_t_type,false,false);
  poVar2 = std::operator<<(poVar2,(string *)&local_80);
  poVar2 = std::operator<<(poVar2,", rhs: ");
  type_name_abi_cxx11_((string *)&members,this,&tstruct->super_t_type,false,false);
  poVar2 = std::operator<<(poVar2,(string *)&members);
  std::operator<<(poVar2,") -> Bool");
  std::__cxx11::string::~string((string *)&members);
  std::__cxx11::string::~string((string *)&local_80);
  block_open(this,out);
  poVar2 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar2,"return");
  m_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_b0);
  sVar3 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
  if (sVar3 == 0) {
    poVar2 = std::operator<<(out," true");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  else {
    bVar1 = t_struct::is_union(tstruct);
    if (bVar1) {
      block_open(this,out);
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"switch (lhs, rhs) {");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      local_118 = (t_field **)
                  std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
      local_b0._M_current = local_118;
      while( true ) {
        tfield_1 = (t_field *)
                   std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                             ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
        bVar1 = __gnu_cxx::operator!=
                          (&local_b0,
                           (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                            *)&tfield_1);
        if (!bVar1) break;
        pptVar4 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_b0);
        this_00 = *pptVar4;
        poVar2 = t_generator::indent((t_generator *)this,out);
        poVar2 = std::operator<<(poVar2,"case (.");
        psVar5 = t_field::get_name_abi_cxx11_(this_00);
        poVar2 = std::operator<<(poVar2,(string *)psVar5);
        poVar2 = std::operator<<(poVar2,"(let lval), .");
        psVar5 = t_field::get_name_abi_cxx11_(this_00);
        poVar2 = std::operator<<(poVar2,(string *)psVar5);
        poVar2 = std::operator<<(poVar2,"(let rval)): return lval == rval");
        std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        operator++(&local_b0);
      }
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"default: return false");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"}");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      t_generator::indent_down((t_generator *)this);
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"}()");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    }
    else {
      std::operator<<(out,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up((t_generator *)this);
      local_b8 = (t_field **)
                 std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
      local_b0._M_current = local_b8;
      while( true ) {
        tfield = (t_field *)
                 std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                           ((vector<t_field_*,_std::allocator<t_field_*>_> *)m_iter._M_current);
        bVar1 = __gnu_cxx::operator!=
                          (&local_b0,
                           (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                            *)&tfield);
        if (!bVar1) break;
        pptVar4 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_b0);
        local_c8 = *pptVar4;
        poVar2 = t_generator::indent((t_generator *)this,out);
        poVar2 = std::operator<<(poVar2,"(lhs.");
        psVar5 = t_field::get_name_abi_cxx11_(local_c8);
        maybe_escape_identifier(&local_e8,this,psVar5);
        poVar2 = std::operator<<(poVar2,(string *)&local_e8);
        pcVar6 = " ";
        if ((this->gen_cocoa_ & 1U) != 0) {
          pcVar6 = " ?";
        }
        poVar2 = std::operator<<(poVar2,pcVar6);
        poVar2 = std::operator<<(poVar2,"== rhs.");
        psVar5 = t_field::get_name_abi_cxx11_(local_c8);
        maybe_escape_identifier(&local_108,this,psVar5);
        poVar2 = std::operator<<(poVar2,(string *)&local_108);
        std::operator<<(poVar2,")");
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_e8);
        __lhs = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator++(&local_b0);
        local_110._M_current =
             (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
        bVar1 = __gnu_cxx::operator!=(__lhs,&local_110);
        if (bVar1) {
          std::operator<<(out," &&");
        }
        std::operator<<(out,(string *)&::endl_abi_cxx11_);
      }
      t_generator::indent_down((t_generator *)this);
    }
  }
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void t_swift_generator::generate_swift_struct_equatable_extension(ostream& out,
                                                                  t_struct* tstruct,
                                                                  bool is_private) {

  string visibility = is_private ? (gen_cocoa_ ? "private" : "fileprivate") : "public";

  indent(out) << visibility << " func ==(lhs: " << type_name(tstruct) << ", rhs: "
              << type_name(tstruct) << ") -> Bool";
  block_open(out);
  indent(out) << "return";

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  if (members.size()) {
    if (!tstruct->is_union()) {
      out << endl;
      indent_up();

      for (m_iter = members.begin(); m_iter != members.end();) {
        t_field* tfield = *m_iter;
        indent(out) << "(lhs." << maybe_escape_identifier(tfield->get_name())
                    << (gen_cocoa_ ? " ?" : " ") << "== rhs." << maybe_escape_identifier(tfield->get_name()) << ")"; // swift 2 ?== operator not in 3?
        if (++m_iter != members.end()) {
          out << " &&";
        }
        out << endl;
      }
      indent_down();
    } else {
      block_open(out);
      indent(out) << "switch (lhs, rhs) {" << endl;
      for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
        t_field* tfield = *m_iter;
        indent(out) << "case (." << tfield->get_name() << "(let lval), ."
                    << tfield->get_name() << "(let rval)): return lval == rval"
                    << endl;
      }
      indent(out) << "default: return false" << endl;
      indent(out) << "}" << endl;
      indent_down();
      indent(out) << "}()" << endl;
    }
  }
  else {
    out << " true" << endl;
  }

  block_close(out);
  out << endl;
}